

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::QWidgetPrivate(QWidgetPrivate *this,QtPrivate_6_10_0 version)

{
  QCoreApplication *pQVar1;
  QtPrivate_6_10_0 in_ESI;
  QWidgetData *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb8;
  InputMethodHint in_stack_ffffffffffffffbc;
  Policy in_stack_ffffffffffffffc8;
  QWidgetData *this_00;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)in_RDI,in_ESI);
  in_RDI->winid = (WId)&PTR__QWidgetPrivate_00d08298;
  std::unique_ptr<QWExtra,std::default_delete<QWExtra>>::
  unique_ptr<std::default_delete<QWExtra>,void>
            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)in_RDI);
  in_RDI[1].pal.d = (QPalettePrivate *)0x0;
  *(undefined8 *)&in_RDI[1].pal.currentGroup = 0;
  *(undefined8 *)&in_RDI[1].fnt = 0;
  *(undefined8 *)&in_RDI[1].field_0x40 = 0;
  in_RDI[1].wrect.x1 = 0;
  in_RDI[1].wrect.y1 = 0;
  in_RDI[1].wrect.x2 = 0;
  in_RDI[1].wrect.y2 = 0;
  in_RDI[2].winid = 0;
  in_RDI[2].widget_attributes = 0;
  in_RDI[2].window_flags = (QFlagsStorageHelper<Qt::WindowType,_4>)0x0;
  *(undefined8 *)&in_RDI[2].field_0x10 = 0;
  in_RDI[2].crect.y1 = 0;
  in_RDI[2].crect.x2 = 0;
  QFlags<Qt::InputMethodHint>::QFlags
            ((QFlags<Qt::InputMethodHint> *)in_RDI,in_stack_ffffffffffffffbc);
  QRegion::QRegion((QRegion *)&in_RDI[2].pal);
  QRegion::QRegion((QRegion *)&in_RDI[2].pal.currentGroup);
  QString::QString((QString *)0x35a702);
  in_RDI[2].wrect.x2.m_i = -1;
  QString::QString((QString *)0x35a71d);
  QString::QString((QString *)0x35a72e);
  QString::QString((QString *)0x35a73f);
  QString::QString((QString *)0x35a750);
  QString::QString((QString *)0x35a761);
  in_RDI[4].crect.y2.m_i = 0;
  *(undefined4 *)&in_RDI[4].field_0x24 = 0;
  in_RDI[4].pal.d = (QPalettePrivate *)0x0;
  *(undefined8 *)&in_RDI[4].pal.currentGroup = 0;
  *(undefined2 *)&in_RDI[4].fnt = 0;
  *(undefined2 *)&in_RDI[4].field_0x3a = 0;
  *(undefined2 *)&in_RDI[4].field_0x3c = 0;
  *(undefined2 *)&in_RDI[4].field_0x3e = 0;
  in_RDI[4].field_0x40 = 0;
  in_RDI[4].field_0x41 = 0;
  in_RDI[4].field_0x42 = 0;
  in_RDI[4].field_0x43 = 0;
  in_RDI[4].wrect.x1 = 0;
  in_RDI[4].wrect.y1 = 0;
  QWidgetData::QWidgetData(in_RDI);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_00,in_ESI,in_stack_ffffffffffffffc8,
             (ControlType)((ulong)in_RDI >> 0x20));
  QLocale::QLocale((QLocale *)(in_RDI + 6));
  QPoint::QPoint((QPoint *)in_RDI);
  QList<QAction_*>::QList((QList<QAction_*> *)0x35a837);
  QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::QMap
            ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)0x35a848);
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xffffff00 | 0x11;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xffff00ff | 0x1100;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xfffeffff | 0x10000;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xfffdffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xfffbffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xfff7ffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xffefffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xffdfffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xffbfffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xff7fffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xfeffffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xfdffffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xfbffffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xf7ffffff | 0x8000000;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xefffffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xdfffffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0xbfffffff;
  *(uint *)&in_RDI[6].field_0x40 = *(uint *)&in_RDI[6].field_0x40 & 0x7fffffff;
  pQVar1 = QCoreApplication::instance();
  if (pQVar1 == (QCoreApplication *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QMessageLogger::fatal(local_28,"QWidget: Must construct a QApplication before a QWidget");
  }
  *(byte *)((long)&(in_RDI->pal).currentGroup + 1) =
       *(byte *)((long)&(in_RDI->pal).currentGroup + 1) | 2;
  *(undefined8 *)&in_RDI[6].pal.currentGroup = 0;
  *(undefined8 *)&in_RDI[6].fnt = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWidgetPrivate::QWidgetPrivate(decltype(QObjectPrivateVersion) version)
    : QObjectPrivate(version)
      , focus_next(nullptr)
      , focus_prev(nullptr)
      , focus_child(nullptr)
      , layout(nullptr)
      , needsFlush(nullptr)
      , redirectDev(nullptr)
      , widgetItem(nullptr)
      , extraPaintEngine(nullptr)
      , polished(nullptr)
      , graphicsEffect(nullptr)
#if !defined(QT_NO_IM)
      , imHints(Qt::ImhNone)
#endif
#if QT_CONFIG(tooltip)
      , toolTipDuration(-1)
#endif
      , directFontResolveMask(0)
      , inheritedFontResolveMask(0)
      , directPaletteResolveMask(0)
      , inheritedPaletteResolveMask(0)
      , leftmargin(0)
      , topmargin(0)
      , rightmargin(0)
      , bottommargin(0)
      , leftLayoutItemMargin(0)
      , topLayoutItemMargin(0)
      , rightLayoutItemMargin(0)
      , bottomLayoutItemMargin(0)
      , hd(nullptr)
      , size_policy(QSizePolicy::Preferred, QSizePolicy::Preferred)
      , fg_role(QPalette::NoRole)
      , bg_role(QPalette::NoRole)
      , dirtyOpaqueChildren(1)
      , isOpaque(0)
      , retainSizeWhenHiddenChanged(0)
      , inDirtyList(0)
      , isScrolled(0)
      , isMoved(0)
      , usesDoubleBufferedGLContext(0)
      , mustHaveWindowHandle(0)
      , renderToTexture(0)
      , textureChildSeen(0)
#ifndef QT_NO_IM
      , inheritsInputMethodHints(0)
#endif
      , renderToTextureReallyDirty(1)
      , usesRhiFlush(0)
      , childrenHiddenByWState(0)
      , childrenShownByExpose(0)
      , dontSetExplicitShowHide(0)
#if defined(Q_OS_WIN)
      , noPaintOnScreen(0)
#endif
{
    if (Q_UNLIKELY(!qApp)) {
        qFatal("QWidget: Must construct a QApplication before a QWidget");
        return;
    }

    willBeWidget = true; // used in QObject's ctor
    memset(high_attributes, 0, sizeof(high_attributes));

#ifdef QWIDGET_EXTRA_DEBUG
    static int count = 0;
    qDebug() << "widgets" << ++count;
#endif
}